

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlDocPtr xmlCopyDoc(xmlDocPtr doc,int recursive)

{
  xmlDocPtr cur;
  char *pcVar1;
  xmlChar *pxVar2;
  xmlDtdPtr tree;
  xmlNsPtr pxVar3;
  _xmlNode *p_Var4;
  _xmlNode *p_Var5;
  
  if ((doc == (xmlDocPtr)0x0) || (cur = xmlNewDoc(doc->version), cur == (xmlDocPtr)0x0)) {
    return (xmlDocPtr)0x0;
  }
  cur->type = doc->type;
  if (doc->name != (char *)0x0) {
    pcVar1 = (*xmlMemStrdup)(doc->name);
    cur->name = pcVar1;
  }
  if (doc->encoding != (xmlChar *)0x0) {
    pxVar2 = xmlStrdup(doc->encoding);
    cur->encoding = pxVar2;
  }
  if (doc->URL != (xmlChar *)0x0) {
    pxVar2 = xmlStrdup(doc->URL);
    cur->URL = pxVar2;
  }
  cur->charset = doc->charset;
  cur->compression = doc->compression;
  cur->standalone = doc->standalone;
  if (recursive != 0) {
    cur->children = (_xmlNode *)0x0;
    cur->last = (_xmlNode *)0x0;
    if (doc->intSubset != (xmlDtdPtr)0x0) {
      tree = xmlCopyDtd(doc->intSubset);
      cur->intSubset = tree;
      if (tree == (xmlDtdPtr)0x0) {
        xmlFreeDoc(cur);
        return (xmlDocPtr)0x0;
      }
      xmlSetTreeDoc((xmlNodePtr)tree,cur);
      cur->intSubset->parent = cur;
    }
    if (doc->oldNs != (xmlNsPtr)0x0) {
      pxVar3 = xmlCopyNamespaceList(doc->oldNs);
      cur->oldNs = pxVar3;
    }
    if (doc->children != (xmlNodePtr)0x0) {
      p_Var4 = xmlStaticCopyNodeList(doc->children,cur,(xmlNodePtr)cur);
      cur->children = p_Var4;
      cur->last = (_xmlNode *)0x0;
      if (p_Var4 != (xmlNodePtr)0x0) {
        do {
          p_Var5 = p_Var4;
          p_Var4 = p_Var5->next;
        } while (p_Var4 != (_xmlNode *)0x0);
        cur->last = p_Var5;
        return cur;
      }
      return cur;
    }
    return cur;
  }
  return cur;
}

Assistant:

xmlDocPtr
xmlCopyDoc(xmlDocPtr doc, int recursive) {
    xmlDocPtr ret;

    if (doc == NULL) return(NULL);
    ret = xmlNewDoc(doc->version);
    if (ret == NULL) return(NULL);
    ret->type = doc->type;
    if (doc->name != NULL)
        ret->name = xmlMemStrdup(doc->name);
    if (doc->encoding != NULL)
        ret->encoding = xmlStrdup(doc->encoding);
    if (doc->URL != NULL)
        ret->URL = xmlStrdup(doc->URL);
    ret->charset = doc->charset;
    ret->compression = doc->compression;
    ret->standalone = doc->standalone;
    if (!recursive) return(ret);

    ret->last = NULL;
    ret->children = NULL;
#ifdef LIBXML_TREE_ENABLED
    if (doc->intSubset != NULL) {
        ret->intSubset = xmlCopyDtd(doc->intSubset);
	if (ret->intSubset == NULL) {
	    xmlFreeDoc(ret);
	    return(NULL);
	}
	xmlSetTreeDoc((xmlNodePtr)ret->intSubset, ret);
	ret->intSubset->parent = ret;
    }
#endif
    if (doc->oldNs != NULL)
        ret->oldNs = xmlCopyNamespaceList(doc->oldNs);
    if (doc->children != NULL) {
	xmlNodePtr tmp;

	ret->children = xmlStaticCopyNodeList(doc->children, ret,
		                               (xmlNodePtr)ret);
	ret->last = NULL;
	tmp = ret->children;
	while (tmp != NULL) {
	    if (tmp->next == NULL)
	        ret->last = tmp;
	    tmp = tmp->next;
	}
    }
    return(ret);
}